

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O1

int get_drl_refmv_count(MACROBLOCK *x,MV_REFERENCE_FRAME *ref_frame,PREDICTION_MODE mode)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  int8_t ref_idx;
  long lVar7;
  
  cVar6 = *ref_frame;
  cVar1 = ref_frame[1];
  if ('\0' < cVar1) {
    cVar5 = -1;
    if (cVar1 < '\x05' || '\x04' < cVar6) {
      lVar7 = 0;
      do {
        if ((cVar6 == (&comp_ref0_lut)[lVar7]) && (cVar1 == (&comp_ref1_lut)[lVar7])) {
          cVar5 = (char)lVar7;
          break;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 9);
    }
    if (cVar5 < '\0') {
      cVar6 = cVar1 * '\x04' + cVar6 + -0xd;
    }
    else {
      cVar6 = cVar5 + '\x14';
    }
  }
  if ((0x15 < mode) || (uVar4 = 1, (0x244000U >> (mode & 0x1f) & 1) == 0)) {
    uVar4 = (uint)(mode == '\x16');
  }
  bVar2 = (x->mbmi_ext).ref_mv_count[cVar6];
  if (((uVar4 == 0) || (bVar2 < 3)) && (((mode & 0xf7) != 0x10 || (bVar2 < 2)))) {
    return 1;
  }
  iVar3 = 3;
  if ((int)(bVar2 - uVar4) < 3) {
    iVar3 = bVar2 - uVar4;
  }
  return iVar3;
}

Assistant:

static inline int8_t av1_ref_frame_type(const MV_REFERENCE_FRAME *const rf) {
  if (rf[1] > INTRA_FRAME) {
    const int8_t uni_comp_ref_idx = get_uni_comp_ref_idx(rf);
    if (uni_comp_ref_idx >= 0) {
      assert((REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx) <
             MODE_CTX_REF_FRAMES);
      return REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx;
    } else {
      return REF_FRAMES + FWD_RF_OFFSET(rf[0]) +
             BWD_RF_OFFSET(rf[1]) * FWD_REFS;
    }
  }

  return rf[0];
}